

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes.c
# Opt level: O3

int CVodeSensInit1(void *cvode_mem,int Ns,int ism,CVSensRhs1Fn fS1,N_Vector *yS0)

{
  long lVar1;
  long lVar2;
  undefined1 auVar3 [16];
  int iVar4;
  void *pvVar5;
  void *pvVar6;
  void *pvVar7;
  void *pvVar8;
  SUNNonlinearSolver NLS;
  ulong uVar9;
  size_t sVar10;
  ulong uVar11;
  char *msgfmt;
  int iVar12;
  bool bVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  int iVar17;
  long lVar16;
  
  if (cvode_mem == (void *)0x0) {
    msgfmt = "cvode_mem = NULL illegal.";
    iVar12 = -0x15;
    cvode_mem = (CVodeMem)0x0;
    iVar17 = -0x15;
    iVar4 = 0x652;
  }
  else if (*(int *)((long)cvode_mem + 0x860) == 0) {
    if (Ns < 1) {
      msgfmt = "NS <= 0 illegal.";
      iVar12 = -0x16;
      iVar17 = -0x16;
      iVar4 = 0x664;
    }
    else {
      *(int *)((long)cvode_mem + 0x90) = Ns;
      if (ism - 4U < 0xfffffffd) {
        msgfmt = 
        "Illegal value for ism. Legal values are: CV_SIMULTANEOUS, CV_STAGGERED and CV_STAGGERED1.";
        iVar12 = -0x16;
        iVar17 = -0x16;
        iVar4 = 0x66e;
      }
      else {
        *(int *)((long)cvode_mem + 0x94) = ism;
        if (yS0 == (N_Vector *)0x0) {
          msgfmt = "yS0 = NULL illegal.";
          iVar12 = -0x16;
          iVar17 = -0x16;
          iVar4 = 0x678;
        }
        else {
          *(undefined4 *)((long)cvode_mem + 0xb4) = 1;
          *(undefined8 *)((long)cvode_mem + 0x98) = 0;
          bVar13 = fS1 == (CVSensRhs1Fn)0x0;
          if (bVar13) {
            fS1 = cvSensRhs1InternalDQ;
            pvVar5 = cvode_mem;
          }
          else {
            pvVar5 = *(void **)((long)cvode_mem + 0x18);
          }
          uVar11 = (ulong)(uint)Ns;
          *(uint *)((long)cvode_mem + 0xb0) = (uint)bVar13;
          *(CVSensRhs1Fn *)((long)cvode_mem + 0xa0) = fS1;
          *(void **)((long)cvode_mem + 0xa8) = pvVar5;
          if (ism == 3) {
            *(undefined4 *)((long)cvode_mem + 0x318) = 1;
            pvVar5 = malloc(uVar11 * 4);
            *(void **)((long)cvode_mem + 0x590) = pvVar5;
            sVar10 = uVar11 * 8;
            pvVar6 = malloc(sVar10);
            *(void **)((long)cvode_mem + 0x670) = pvVar6;
            pvVar7 = malloc(sVar10);
            *(void **)((long)cvode_mem + 0x688) = pvVar7;
            pvVar8 = malloc(sVar10);
            *(void **)((long)cvode_mem + 0x6a0) = pvVar8;
            if ((pvVar6 == (void *)0x0 || pvVar5 == (void *)0x0) ||
               (pvVar7 == (void *)0x0 || pvVar8 == (void *)0x0)) {
              msgfmt = "A memory request failed.";
              iVar12 = -0x14;
              iVar17 = -0x14;
              iVar4 = 0x69f;
              goto LAB_00114ca9;
            }
          }
          else {
            *(undefined4 *)((long)cvode_mem + 0x318) = 0;
          }
          iVar4 = cvSensAllocVectors((CVodeMem)cvode_mem,*yS0);
          if (iVar4 != 0) {
            if (Ns != 1) {
              free(*(void **)((long)cvode_mem + 0xa50));
              *(undefined8 *)((long)cvode_mem + 0xa50) = 0;
              free(*(void **)((long)cvode_mem + 0xa58));
              *(undefined8 *)((long)cvode_mem + 0xa58) = 0;
              free(*(void **)((long)cvode_mem + 0xa60));
              sVar10 = (ulong)(uint)(Ns * 0xd) << 3;
              pvVar5 = malloc(sVar10);
              *(void **)((long)cvode_mem + 0xa50) = pvVar5;
              pvVar6 = malloc(sVar10);
              *(void **)((long)cvode_mem + 0xa58) = pvVar6;
              pvVar7 = malloc(sVar10);
              *(void **)((long)cvode_mem + 0xa60) = pvVar7;
              if ((pvVar5 == (void *)0x0) || (pvVar6 == (void *)0x0 || pvVar7 == (void *)0x0)) {
                if (*(int *)((long)cvode_mem + 0x318) != 0) {
                  free(*(void **)((long)cvode_mem + 0x590));
                  *(undefined8 *)((long)cvode_mem + 0x590) = 0;
                  free(*(void **)((long)cvode_mem + 0x670));
                  *(undefined8 *)((long)cvode_mem + 0x670) = 0;
                  free(*(void **)((long)cvode_mem + 0x688));
                  *(undefined8 *)((long)cvode_mem + 0x688) = 0;
                  free(*(void **)((long)cvode_mem + 0x6a0));
                  *(undefined8 *)((long)cvode_mem + 0x6a0) = 0;
                }
                cvSensFreeVectors((CVodeMem)cvode_mem);
                msgfmt = "A memory request failed.";
                iVar12 = -0x14;
                iVar17 = -0x14;
                iVar4 = 0x6d8;
                goto LAB_00114ca9;
              }
            }
            auVar3 = _DAT_00138040;
            lVar1 = *(long *)((long)cvode_mem + 0xa50);
            lVar16 = uVar11 - 1;
            auVar14._8_4_ = (int)lVar16;
            auVar14._0_8_ = lVar16;
            auVar14._12_4_ = (int)((ulong)lVar16 >> 0x20);
            uVar9 = 0;
            auVar14 = auVar14 ^ _DAT_00138040;
            auVar15 = _DAT_00138030;
            do {
              bVar13 = auVar14._0_4_ < SUB164(auVar15 ^ auVar3,0);
              iVar4 = auVar14._4_4_;
              iVar17 = SUB164(auVar15 ^ auVar3,4);
              if ((bool)(~(iVar4 < iVar17 || iVar17 == iVar4 && bVar13) & 1)) {
                *(undefined8 *)(lVar1 + uVar9 * 8) = 0x3ff0000000000000;
              }
              if (iVar4 >= iVar17 && (iVar17 != iVar4 || !bVar13)) {
                *(undefined8 *)(lVar1 + 8 + uVar9 * 8) = 0x3ff0000000000000;
              }
              uVar9 = uVar9 + 2;
              lVar16 = auVar15._8_8_;
              auVar15._0_8_ = auVar15._0_8_ + 2;
              auVar15._8_8_ = lVar16 + 2;
            } while ((Ns + 1U & 0xfffffffe) != uVar9);
            iVar4 = N_VScaleVectorArray(Ns,lVar1,yS0,*(undefined8 *)((long)cvode_mem + 0x288));
            if (iVar4 != 0) {
              return -0x1c;
            }
            *(undefined8 *)((long)cvode_mem + 0x668) = 0;
            *(undefined8 *)((long)cvode_mem + 0x6b8) = 0;
            *(undefined8 *)((long)cvode_mem + 0x680) = 0;
            *(undefined8 *)((long)cvode_mem + 0x698) = 0;
            *(undefined8 *)((long)cvode_mem + 0x6d0) = 0;
            *(undefined1 (*) [16])((long)cvode_mem + 0x640) = (undefined1  [16])0x0;
            if (ism == 3) {
              lVar16 = *(long *)((long)cvode_mem + 0x670);
              lVar1 = *(long *)((long)cvode_mem + 0x688);
              lVar2 = *(long *)((long)cvode_mem + 0x6a0);
              uVar9 = 0;
              do {
                *(undefined8 *)(lVar16 + uVar9 * 8) = 0;
                *(undefined8 *)(lVar1 + uVar9 * 8) = 0;
                *(undefined8 *)(lVar2 + uVar9 * 8) = 0;
                uVar9 = uVar9 + 1;
              } while (uVar11 != uVar9);
            }
            lVar16 = *(long *)((long)cvode_mem + 0xc0);
            lVar1 = *(long *)((long)cvode_mem + 200);
            uVar9 = 0;
            do {
              *(int *)(lVar1 + uVar9 * 4) = (int)uVar9;
              *(undefined8 *)(lVar16 + uVar9 * 8) = 0x3ff0000000000000;
              uVar9 = uVar9 + 1;
            } while (uVar11 != uVar9);
            *(undefined4 *)((long)cvode_mem + 0x8c) = 1;
            *(undefined4 *)((long)cvode_mem + 0x860) = 1;
            if (ism == 1) {
              NLS = SUNNonlinSol_NewtonSens
                              (Ns + 1U,*(N_Vector *)((long)cvode_mem + 0x1c8),*cvode_mem);
              if (NLS == (SUNNonlinearSolver)0x0) goto LAB_00115295;
              iVar4 = CVodeSetNonlinearSolverSensSim(cvode_mem,NLS);
              if (iVar4 != 0) goto LAB_00115254;
              *(undefined4 *)((long)cvode_mem + 0x740) = 1;
            }
            else if (ism == 2) {
              NLS = SUNNonlinSol_NewtonSens(Ns,*(N_Vector *)((long)cvode_mem + 0x1c8),*cvode_mem);
              if (NLS == (SUNNonlinearSolver)0x0) {
LAB_00115295:
                cvProcessError((CVodeMem)cvode_mem,-0x14,0x717,"CVodeSensInit1",
                               "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes.c"
                               ,"A memory request failed.");
                cvSensFreeVectors((CVodeMem)cvode_mem);
                return -0x14;
              }
              iVar4 = CVodeSetNonlinearSolverSensStg(cvode_mem,NLS);
              if (iVar4 != 0) {
LAB_00115254:
                cvProcessError((CVodeMem)cvode_mem,iVar4,0x72b,"CVodeSensInit1",
                               "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes.c"
                               ,"Setting the nonlinear solver failed");
                cvSensFreeVectors((CVodeMem)cvode_mem);
                SUNNonlinSolFree(NLS);
                return -0x14;
              }
              *(undefined4 *)((long)cvode_mem + 0x750) = 1;
            }
            else {
              NLS = SUNNonlinSol_Newton(*(N_Vector *)((long)cvode_mem + 0x1c8),*cvode_mem);
              if (NLS == (SUNNonlinearSolver)0x0) goto LAB_00115295;
              iVar4 = CVodeSetNonlinearSolverSensStg1(cvode_mem,NLS);
              if (iVar4 != 0) goto LAB_00115254;
              *(undefined4 *)((long)cvode_mem + 0x760) = 1;
            }
            return 0;
          }
          if (*(int *)((long)cvode_mem + 0x318) != 0) {
            free(*(void **)((long)cvode_mem + 0x590));
            *(undefined8 *)((long)cvode_mem + 0x590) = 0;
            free(*(void **)((long)cvode_mem + 0x670));
            *(undefined8 *)((long)cvode_mem + 0x670) = 0;
            free(*(void **)((long)cvode_mem + 0x688));
            *(undefined8 *)((long)cvode_mem + 0x688) = 0;
            free(*(void **)((long)cvode_mem + 0x6a0));
            *(undefined8 *)((long)cvode_mem + 0x6a0) = 0;
          }
          msgfmt = "A memory request failed.";
          iVar12 = -0x14;
          iVar17 = -0x14;
          iVar4 = 0x6b6;
        }
      }
    }
  }
  else {
    msgfmt = "Sensitivity analysis already initialized.";
    iVar12 = -0x16;
    iVar17 = -0x16;
    iVar4 = 0x65b;
  }
LAB_00114ca9:
  cvProcessError((CVodeMem)cvode_mem,iVar17,iVar4,"CVodeSensInit1",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes.c"
                 ,msgfmt);
  return iVar12;
}

Assistant:

int CVodeSensInit1(void* cvode_mem, int Ns, int ism, CVSensRhs1Fn fS1,
                   N_Vector* yS0)
{
  CVodeMem cv_mem;
  sunbooleantype allocOK;
  int is, retval;
  SUNNonlinearSolver NLS;

  /* Check cvode_mem */

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }
  cv_mem = (CVodeMem)cvode_mem;

  /* Check if CVodeSensInit or CVodeSensInit1 was already called */

  if (cv_mem->cv_SensMallocDone)
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   MSGCV_SENSINIT_2);
    return (CV_ILL_INPUT);
  }

  /* Check if Ns is legal */

  if (Ns <= 0)
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   MSGCV_BAD_NS);
    return (CV_ILL_INPUT);
  }
  cv_mem->cv_Ns = Ns;

  /* Check if ism is legal */

  if ((ism != CV_SIMULTANEOUS) && (ism != CV_STAGGERED) && (ism != CV_STAGGERED1))
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   MSGCV_BAD_ISM);
    return (CV_ILL_INPUT);
  }
  cv_mem->cv_ism = ism;

  /* Check if yS0 is non-null */

  if (yS0 == NULL)
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   MSGCV_NULL_YS0);
    return (CV_ILL_INPUT);
  }

  /* Store sensitivity RHS-related data */

  cv_mem->cv_ifS = CV_ONESENS;
  cv_mem->cv_fS  = NULL;

  if (fS1 == NULL)
  {
    cv_mem->cv_fSDQ    = SUNTRUE;
    cv_mem->cv_fS1     = cvSensRhs1InternalDQ;
    cv_mem->cv_fS_data = cvode_mem;
  }
  else
  {
    cv_mem->cv_fSDQ    = SUNFALSE;
    cv_mem->cv_fS1     = fS1;
    cv_mem->cv_fS_data = cv_mem->cv_user_data;
  }

  /* Allocate ncfS1, ncfnS1, and nniS1 if needed */

  if (ism == CV_STAGGERED1)
  {
    cv_mem->cv_stgr1alloc = SUNTRUE;
    cv_mem->cv_ncfS1      = NULL;
    cv_mem->cv_ncfS1      = (int*)malloc(Ns * sizeof(int));
    cv_mem->cv_ncfnS1     = NULL;
    cv_mem->cv_ncfnS1     = (long int*)malloc(Ns * sizeof(long int));
    cv_mem->cv_nniS1      = NULL;
    cv_mem->cv_nniS1      = (long int*)malloc(Ns * sizeof(long int));
    cv_mem->cv_nnfS1      = NULL;
    cv_mem->cv_nnfS1      = (long int*)malloc(Ns * sizeof(long int));
    if ((cv_mem->cv_ncfS1 == NULL) || (cv_mem->cv_ncfnS1 == NULL) ||
        (cv_mem->cv_nniS1 == NULL) || (cv_mem->cv_nnfS1 == NULL))
    {
      cvProcessError(cv_mem, CV_MEM_FAIL, __LINE__, __func__, __FILE__,
                     MSGCV_MEM_FAIL);
      return (CV_MEM_FAIL);
    }
  }
  else { cv_mem->cv_stgr1alloc = SUNFALSE; }

  /* Allocate the vectors (using yS0[0] as a template) */

  allocOK = cvSensAllocVectors(cv_mem, yS0[0]);
  if (!allocOK)
  {
    if (cv_mem->cv_stgr1alloc)
    {
      free(cv_mem->cv_ncfS1);
      cv_mem->cv_ncfS1 = NULL;
      free(cv_mem->cv_ncfnS1);
      cv_mem->cv_ncfnS1 = NULL;
      free(cv_mem->cv_nniS1);
      cv_mem->cv_nniS1 = NULL;
      free(cv_mem->cv_nnfS1);
      cv_mem->cv_nnfS1 = NULL;
    }
    cvProcessError(cv_mem, CV_MEM_FAIL, __LINE__, __func__, __FILE__,
                   MSGCV_MEM_FAIL);
    return (CV_MEM_FAIL);
  }

  /* Check if larger temporary work arrays are needed for fused vector ops */
  if (Ns * L_MAX > L_MAX)
  {
    free(cv_mem->cv_cvals);
    cv_mem->cv_cvals = NULL;
    free(cv_mem->cv_Xvecs);
    cv_mem->cv_Xvecs = NULL;
    free(cv_mem->cv_Zvecs);
    cv_mem->cv_Zvecs = NULL;

    cv_mem->cv_cvals = (sunrealtype*)malloc((Ns * L_MAX) * sizeof(sunrealtype));
    cv_mem->cv_Xvecs = (N_Vector*)malloc((Ns * L_MAX) * sizeof(N_Vector));
    cv_mem->cv_Zvecs = (N_Vector*)malloc((Ns * L_MAX) * sizeof(N_Vector));

    if ((cv_mem->cv_cvals == NULL) || (cv_mem->cv_Xvecs == NULL) ||
        (cv_mem->cv_Zvecs == NULL))
    {
      if (cv_mem->cv_stgr1alloc)
      {
        free(cv_mem->cv_ncfS1);
        cv_mem->cv_ncfS1 = NULL;
        free(cv_mem->cv_ncfnS1);
        cv_mem->cv_ncfnS1 = NULL;
        free(cv_mem->cv_nniS1);
        cv_mem->cv_nniS1 = NULL;
        free(cv_mem->cv_nnfS1);
        cv_mem->cv_nnfS1 = NULL;
      }
      cvSensFreeVectors(cv_mem);
      cvProcessError(cv_mem, CV_MEM_FAIL, __LINE__, __func__, __FILE__,
                     MSGCV_MEM_FAIL);
      return (CV_MEM_FAIL);
    }
  }

  /*----------------------------------------------
    All error checking is complete at this point
    -----------------------------------------------*/

  /* Initialize znS[0] in the history array */

  for (is = 0; is < Ns; is++) { cv_mem->cv_cvals[is] = ONE; }

  retval = N_VScaleVectorArray(Ns, cv_mem->cv_cvals, yS0, cv_mem->cv_znS[0]);
  if (retval != CV_SUCCESS) { return (CV_VECTOROP_ERR); }

  /* Initialize all sensitivity related counters */

  cv_mem->cv_nfSe     = 0;
  cv_mem->cv_nfeS     = 0;
  cv_mem->cv_ncfnS    = 0;
  cv_mem->cv_netfS    = 0;
  cv_mem->cv_nniS     = 0;
  cv_mem->cv_nnfS     = 0;
  cv_mem->cv_nsetupsS = 0;
  if (ism == CV_STAGGERED1)
  {
    for (is = 0; is < Ns; is++)
    {
      cv_mem->cv_ncfnS1[is] = 0;
      cv_mem->cv_nniS1[is]  = 0;
      cv_mem->cv_nnfS1[is]  = 0;
    }
  }

  /* Set default values for plist and pbar */

  for (is = 0; is < Ns; is++)
  {
    cv_mem->cv_plist[is] = is;
    cv_mem->cv_pbar[is]  = ONE;
  }

  /* Sensitivities will be computed */

  cv_mem->cv_sensi          = SUNTRUE;
  cv_mem->cv_SensMallocDone = SUNTRUE;

  /* create a Newton nonlinear solver object by default */
  if (ism == CV_SIMULTANEOUS)
  {
    NLS = SUNNonlinSol_NewtonSens(Ns + 1, cv_mem->cv_acor, cv_mem->cv_sunctx);
  }
  else if (ism == CV_STAGGERED)
  {
    NLS = SUNNonlinSol_NewtonSens(Ns, cv_mem->cv_acor, cv_mem->cv_sunctx);
  }
  else { NLS = SUNNonlinSol_Newton(cv_mem->cv_acor, cv_mem->cv_sunctx); }

  /* check that the nonlinear solver is non-NULL */
  if (NLS == NULL)
  {
    cvProcessError(cv_mem, CV_MEM_FAIL, __LINE__, __func__, __FILE__,
                   MSGCV_MEM_FAIL);
    cvSensFreeVectors(cv_mem);
    return (CV_MEM_FAIL);
  }

  /* attach the nonlinear solver to the CVODE memory */
  if (ism == CV_SIMULTANEOUS)
  {
    retval = CVodeSetNonlinearSolverSensSim(cv_mem, NLS);
  }
  else if (ism == CV_STAGGERED)
  {
    retval = CVodeSetNonlinearSolverSensStg(cv_mem, NLS);
  }
  else { retval = CVodeSetNonlinearSolverSensStg1(cv_mem, NLS); }

  /* check that the nonlinear solver was successfully attached */
  if (retval != CV_SUCCESS)
  {
    cvProcessError(cv_mem, retval, __LINE__, __func__, __FILE__,
                   "Setting the nonlinear solver failed");
    cvSensFreeVectors(cv_mem);
    SUNNonlinSolFree(NLS);
    return (CV_MEM_FAIL);
  }

  /* set ownership flag */
  if (ism == CV_SIMULTANEOUS) { cv_mem->ownNLSsim = SUNTRUE; }
  else if (ism == CV_STAGGERED) { cv_mem->ownNLSstg = SUNTRUE; }
  else { cv_mem->ownNLSstg1 = SUNTRUE; }

  /* Sensitivity initialization was successfull */
  return (CV_SUCCESS);
}